

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.hpp
# Opt level: O2

void __thiscall
jsoncons::stream_source<wchar_t>::stream_source
          (stream_source<wchar_t> *this,basic_istream<wchar_t,_std::char_traits<wchar_t>_> *is,
          size_t buf_size)

{
  allocator_type local_19;
  
  basic_null_istream<wchar_t>::basic_null_istream(&this->null_is_);
  this->stream_ptr_ = is;
  this->sbuf_ = *(basic_streambuf<wchar_t,_std::char_traits<wchar_t>_> **)
                 (&is->field_0xe8 + (long)is->_vptr_basic_istream[-3]);
  this->position_ = 0;
  std::vector<wchar_t,_std::allocator<wchar_t>_>::vector(&this->buffer_,buf_size,&local_19);
  this->buffer_data_ =
       (this->buffer_).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
       super__Vector_impl_data._M_start;
  this->buffer_length_ = 0;
  return;
}

Assistant:

stream_source(std::basic_istream<char_type>& is, std::size_t buf_size = default_max_buffer_size)
            : stream_ptr_(std::addressof(is)), sbuf_(is.rdbuf()),
              buffer_(buf_size), buffer_data_(buffer_.data())
        {
        }